

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  Parse *pParse;
  sqlite3 *db;
  int iVar1;
  Select *pSVar2;
  SrcList *pSVar3;
  Expr *pExpr;
  ExprList *pEVar4;
  ExprList_item *pEVar5;
  long lVar6;
  Select *pSVar7;
  Select *pSVar8;
  byte bVar9;
  Token dummy;
  Token local_58;
  Token local_40;
  
  bVar9 = 0;
  if (p->pPrior == (Select *)0x0) {
    return 0;
  }
  pSVar2 = (Select *)p->pOrderBy;
  pSVar8 = p;
  pSVar7 = pSVar2;
  while( true ) {
    if (pSVar7 == (Select *)0x0) {
      return 0;
    }
    if ((pSVar8->op != 't') && (pSVar8->op != 'q')) break;
    pSVar8 = pSVar8->pPrior;
    pSVar7 = pSVar8;
  }
  iVar1 = *(uint *)&pSVar2->pEList + 1;
  pEVar5 = *(ExprList_item **)&pSVar2->op + *(uint *)&pSVar2->pEList;
  do {
    pEVar5 = pEVar5 + -1;
    iVar1 = iVar1 + -1;
    if (iVar1 < 1) {
      return 0;
    }
  } while ((pEVar5->pExpr->flags & 0x100) == 0);
  pParse = pWalker->pParse;
  db = pParse->db;
  pSVar2 = (Select *)sqlite3DbMallocRaw(db,0x78);
  iVar1 = 2;
  if (pSVar2 != (Select *)0x0) {
    pSVar2->pRightmost = (Select *)0x0;
    pSVar2->pLimit = (Expr *)0x0;
    pSVar2->pPrior = (Select *)0x0;
    pSVar2->pNext = (Select *)0x0;
    pSVar2->pHaving = (Expr *)0x0;
    pSVar2->pOrderBy = (ExprList *)0x0;
    pSVar2->pWhere = (Expr *)0x0;
    pSVar2->pGroupBy = (ExprList *)0x0;
    pSVar2->nSelectRow = 0.0;
    pSVar2->pSrc = (SrcList *)0x0;
    pSVar2->iOffset = 0;
    pSVar2->addrOpenEphm[0] = 0;
    pSVar2->addrOpenEphm[1] = 0;
    pSVar2->addrOpenEphm[2] = 0;
    pSVar2->pEList = (ExprList *)0x0;
    pSVar2->op = '\0';
    pSVar2->field_0x9 = 0;
    pSVar2->selFlags = 0;
    pSVar2->iLimit = 0;
    pSVar2->pOffset = (Expr *)0x0;
    local_58.z = (char *)0x0;
    local_58.n = 0;
    local_58._12_4_ = 0;
    pSVar3 = sqlite3SrcListAppendFromTerm
                       (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,&local_58,pSVar2,(Expr *)0x0
                        ,(IdList *)0x0);
    if (pSVar3 != (SrcList *)0x0) {
      pSVar7 = p;
      pSVar8 = pSVar2;
      for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
        pSVar8->pEList = pSVar7->pEList;
        pSVar7 = (Select *)((long)pSVar7 + (ulong)bVar9 * -0x10 + 8);
        pSVar8 = (Select *)((long)pSVar8 + (ulong)bVar9 * -0x10 + 8);
      }
      p->pSrc = pSVar3;
      local_40.z = (char *)0x0;
      local_40.n = 0;
      pExpr = sqlite3ExprAlloc(db,0x71,&local_40,0);
      pEVar4 = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
      p->pEList = pEVar4;
      p->op = 't';
      p->pWhere = (Expr *)0x0;
      pSVar2->pGroupBy = (ExprList *)0x0;
      pSVar2->pHaving = (Expr *)0x0;
      pSVar2->pOrderBy = (ExprList *)0x0;
      p->pPrior = (Select *)0x0;
      pSVar2->pLimit = (Expr *)0x0;
      pSVar2->pOffset = (Expr *)0x0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ALL, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  pNew->pLimit = 0;
  pNew->pOffset = 0;
  return WRC_Continue;
}